

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.h
# Opt level: O0

void __thiscall ImgClass::~ImgClass(ImgClass *this)

{
  ImgClass *this_local;
  
  if (this->data != (uchar *)0x0) {
    operator_delete__(this->data);
  }
  this->data = (uchar *)0x0;
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~ImgClass() {
        delete []data;
        data = NULL;
    }